

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O2

void __thiscall CfdLogger_Destructor_Test::TestBody(CfdLogger_Destructor_Test *this)

{
  bool bVar1;
  AssertHelper local_50;
  CfdLogger local_48;
  CfdLogger logger;
  
  cfd::core::logger::CfdLogger::CfdLogger(&logger);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::logger::CfdLogger::CfdLogger(&local_48);
      logger.default_logger_ = local_48.default_logger_;
      logger.function_address_ = local_48.function_address_;
      logger.is_alive_ = local_48.is_alive_;
      logger._1_3_ = local_48._1_3_;
      logger.log_level_ = local_48.log_level_;
      logger.is_initialized_ = local_48.is_initialized_;
      logger.is_extend_log_ = local_48.is_extend_log_;
      logger.is_use_default_logger_ = local_48.is_use_default_logger_;
      logger._11_5_ = local_48._11_5_;
      cfd::core::logger::CfdLogger::~CfdLogger(&local_48);
    }
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x28,
               "Expected: (logger = CfdLogger()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  cfd::core::logger::CfdLogger::~CfdLogger(&logger);
  return;
}

Assistant:

TEST(CfdLogger, Destructor) {
  CfdLogger logger;
  EXPECT_NO_THROW((logger = CfdLogger()));
}